

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FStar_UInt_8_16_32_64.h
# Opt level: O2

uint64_t FStar_UInt64_gte_mask(uint64_t a,uint64_t b)

{
  uint64_t y;
  
  return 0xffffffffffffffff - ((long)((a - b ^ b | b ^ a) ^ a) >> 0x3f);
}

Assistant:

static KRML_NOINLINE uint64_t FStar_UInt64_gte_mask(uint64_t a, uint64_t b)
{
  uint64_t x = a;
  uint64_t y = b;
  uint64_t x_xor_y = x ^ y;
  uint64_t x_sub_y = x - y;
  uint64_t x_sub_y_xor_y = x_sub_y ^ y;
  uint64_t q = x_xor_y | x_sub_y_xor_y;
  uint64_t x_xor_q = x ^ q;
  uint64_t x_xor_q_ = x_xor_q >> 63U;
  return x_xor_q_ - 1ULL;
}